

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

int __thiscall
cmCTestSubmitHandler::HandleCDashUploadFile
          (cmCTestSubmitHandler *this,string *file,string *typeString)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  string *source;
  bool bVar3;
  int iVar4;
  Int IVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  cmValue cVar7;
  undefined7 extraout_var;
  string *psVar8;
  ostream *poVar9;
  cmCTestScriptHandler *pcVar10;
  long lVar11;
  long lVar12;
  Value *pVVar13;
  char *extraout_RDX;
  ulong uVar14;
  cmCTestSubmitHandler *pcVar15;
  string_view arg;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string response;
  unsigned_long retryCount;
  string url;
  string fields;
  string upload_as;
  Value json;
  unsigned_long retryDelayValue;
  string retryCountString;
  string retryDelayString;
  ostringstream fstr;
  string md5sum;
  string curlopt;
  ostringstream str;
  cmCTestCurl curl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Reader reader;
  string local_8f8;
  undefined4 local_8d4;
  cmCTestSubmitHandler *local_8d0;
  string local_8c8;
  char *local_8a8;
  unsigned_long local_8a0;
  string local_898;
  string local_878;
  string *local_858;
  long local_850;
  string local_848;
  string local_828;
  ValueHolder local_808 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  undefined1 local_7e0 [112];
  ios_base local_770 [264];
  string *local_668;
  string local_660;
  string local_640;
  undefined1 local_620 [112];
  ios_base local_5b0 [264];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [6];
  ios_base local_338 [264];
  string local_230;
  string local_210;
  string local_1f0;
  cmCTestCurl local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  undefined1 local_140 [80];
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> local_f0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [3];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  if (file->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,"Upload file not specified\n",0x1a);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1ed,(char *)local_620._0_8_,false);
LAB_00592c98:
    if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    std::ios_base::~ios_base(local_338);
    return -1;
  }
  bVar3 = cmsys::SystemTools::FileExists(file);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,"Upload file not found: \'",0x18);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a8,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'\n",2);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1f2,(char *)local_620._0_8_,false);
    goto LAB_00592c98;
  }
  cmCTestCurl::cmCTestCurl(&local_1d0,(this->super_cmCTestGenericHandler).CTest);
  local_1d0.Quiet = (this->super_cmCTestGenericHandler).Quiet;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"CurlOptions","");
  cmCTest::GetCTestConfiguration(&local_3c8,pcVar1,(string *)local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
  }
  arg._M_str = local_3c8._M_dataplus._M_p;
  arg._M_len = local_3c8._M_string_length;
  cmExpandedList_abi_cxx11_(&local_158,arg,false);
  cmCTestCurl::SetCurlOptions(&local_1d0,&local_158);
  iVar4 = GetSubmitInactivityTimeout(this);
  if (iVar4 != 0) {
    local_1d0.TimeOutSeconds = iVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_1d0.HttpHeaders,&this->HttpHeaders);
  cmCTest::GetSubmitURL_abi_cxx11_(&local_898,(this->super_cmCTestGenericHandler).CTest);
  local_3a8._0_8_ = local_898._M_string_length;
  local_3a8._8_8_ = local_898._M_dataplus._M_p;
  __str._M_str = "http://";
  __str._M_len = 7;
  iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_3a8,0,7,__str);
  if (iVar4 != 0) {
    local_3a8._0_8_ = local_898._M_string_length;
    local_3a8._8_8_ = local_898._M_dataplus._M_p;
    __str_00._M_str = "https://";
    __str_00._M_len = 8;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_3a8,0,8,__str_00);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a8,"Only http and https are supported for CDASH_UPLOAD\n",0x33);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x203,(char *)local_620._0_8_,false);
      if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
        operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      std::ios_base::~ios_base(local_338);
      iVar4 = -1;
      goto LAB_00594a4a;
    }
  }
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  local_878._M_string_length = 0;
  local_878.field_2._M_local_buf[0] = '\0';
  local_668 = typeString;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::find((char)&local_898,0x3f);
  if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_3a8,(ulong)&local_898);
    std::__cxx11::string::operator=((string *)&local_878,(string *)local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ != local_398) {
      operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
    }
    if (local_898._M_string_length < paVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 paVar6);
    }
    local_898._M_dataplus._M_p[(long)paVar6] = '\0';
    local_898._M_string_length = (size_type)paVar6;
  }
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"InternalTest","");
  cVar7 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3a8);
  if (cVar7.Value == (string *)0x0) {
    local_8d4 = 0;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar7.Value)->_M_string_length,value);
    local_8d4 = (undefined4)CONCAT71(extraout_var,bVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
  }
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"RetryDelay","");
  psVar8 = (string *)
           cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3a8);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_640,pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
  }
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"RetryCount","");
  psVar8 = (string *)
           cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3a8);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_660,pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
  }
  if (local_640._M_string_length == 0) {
LAB_00593013:
    local_8a8 = (char *)0x0;
  }
  else {
    local_7e0._0_8_ = (char *)0x0;
    bVar3 = cmStrToULong(&local_640,(unsigned_long *)local_7e0);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a8,"Invalid value for \'RETRY_DELAY\' : ",0x22);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3a8,local_640._M_dataplus._M_p,local_640._M_string_length
                         );
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x218,(char *)local_620._0_8_,false);
      if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
        operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      std::ios_base::~ios_base(local_338);
      goto LAB_00593013;
    }
    local_8a8 = (char *)local_7e0._0_8_;
  }
  local_8a0 = 0;
  if ((local_660._M_string_length != 0) && (bVar3 = cmStrToULong(&local_660,&local_8a0), !bVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,"Invalid value for \'RETRY_DELAY\' : ",0x22);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a8,local_660._M_dataplus._M_p,local_660._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x222,(char *)local_620._0_8_,false);
    if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    std::ios_base::~ios_base(local_338);
  }
  cmSystemTools::ComputeFileHash(&local_4a8,file,AlgoMD5);
  pcVar10 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
  this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
  super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((pcVar10->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
         super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
         super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"SubProject","");
  cVar7 = cmState::GetGlobalProperty
                    ((cmState *)
                     this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,local_398[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
  if (cVar7.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"subproject=",0xb);
    cmCTestCurl::Escape((string *)local_620,&local_1d0,cVar7.Value);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a8,(char *)local_620._0_8_,local_620._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
    if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"stamp=",6);
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_7e0,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape((string *)local_620,&local_1d0,(string *)local_7e0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3a8,(char *)local_620._0_8_,local_620._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-",1);
  cmCTest::GetTestModelString_abi_cxx11_
            ((string *)local_808,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape((string *)local_140,&local_1d0,(string *)local_808);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_140._0_8_,local_140._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"model=",6);
  cmCTest::GetTestModelString_abi_cxx11_(&local_828,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_8c8,&local_1d0,&local_828);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"build=",6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"BuildName","");
  cmCTest::GetCTestConfiguration(&local_848,pcVar1,&local_3e8);
  cmCTestCurl::Escape(&local_8f8,&local_1d0,&local_848);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"site=",5);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_8d0 = this;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Site","");
  cmCTest::GetCTestConfiguration(&local_1f0,pcVar1,&local_428);
  cmCTestCurl::Escape(&local_408,&local_1d0,&local_1f0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_408._M_dataplus._M_p,local_408._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"group=",6);
  cmCTest::GetTestModelString_abi_cxx11_(&local_210,(local_8d0->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_448,&local_1d0,&local_210);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_448._M_dataplus._M_p,local_448._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"track=",6);
  cmCTest::GetTestModelString_abi_cxx11_(&local_230,(local_8d0->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_468,&local_1d0,&local_230);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_468._M_dataplus._M_p,local_468._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"starttime=",10);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"endtime=",8);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"datafilesmd5[0]=",0x10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"type=",5);
  cmCTestCurl::Escape(&local_488,&local_1d0,local_668);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,local_488._M_dataplus._M_p,local_488._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  pcVar15 = local_8d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,
                    CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                             local_8c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (local_808[0] != &local_7f8) {
    operator_delete(local_808[0].string_,local_7f8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
    operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
  }
  if (local_878._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&local_878);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&local_878,local_620._0_8_);
  if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
    operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_620,"fields: ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_620,local_878._M_dataplus._M_p,local_878._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nurl:",5);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_898._M_dataplus._M_p,local_898._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nfile: ",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x24e,(char *)local_7e0._0_8_,(pcVar15->super_cmCTestGenericHandler).Quiet);
  if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
    operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
  std::ios_base::~ios_base(local_5b0);
  local_8c8._M_string_length = 0;
  local_8c8.field_2._M_local_buf[0] = '\0';
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  bVar3 = cmCTestCurl::HttpRequest(&local_1d0,&local_898,&local_878,&local_8c8);
  local_858 = file;
  if ((!bVar3 && (char)local_8d4 == '\0') && (local_8a0 != 0)) {
    local_850 = (long)local_8a8 * 1000000000;
    uVar14 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_620,"   Request failed, waiting ",0x1b);
      poVar9 = std::ostream::_M_insert<long>((long)local_620);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds...\n",0xc);
      pcVar15 = local_8d0;
      pcVar1 = (local_8d0->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,600,(char *)local_7e0._0_8_,(pcVar15->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
        operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
      std::ios_base::~ios_base(local_5b0);
      lVar11 = std::chrono::_V2::steady_clock::now();
      lVar11 = lVar11 + local_850;
      while (lVar12 = std::chrono::_V2::steady_clock::now(), lVar12 < lVar11) {
        cmsys::SystemTools::Delay(100);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_620,"   Retry request: Attempt ",0x1a);
      uVar14 = uVar14 + 1;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_620);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar15 = local_8d0;
      pcVar1 = (local_8d0->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x262,(char *)local_7e0._0_8_,(pcVar15->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
        operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
      std::ios_base::~ios_base(local_5b0);
      bVar3 = cmCTestCurl::HttpRequest(&local_1d0,&local_898,&local_878,&local_8c8);
      if (bVar3) goto LAB_00593d18;
    } while (uVar14 < local_8a0);
    bVar3 = false;
  }
  if (bVar3 == false && (char)local_8d4 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_620,"Error in HttpRequest\n",0x15);
    pcVar15 = local_8d0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_620,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
    pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x26d,(char *)local_7e0._0_8_,false);
    if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
      operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
    std::ios_base::~ios_base(local_5b0);
    iVar4 = -1;
  }
  else {
LAB_00593d18:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_620,"Request upload response: [",0x1a);
    source = local_668;
    psVar8 = local_858;
    pcVar15 = local_8d0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_620,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
    pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x272,(char *)local_7e0._0_8_,(pcVar15->super_cmCTestGenericHandler).Quiet);
    if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
      operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
    std::ios_base::~ios_base(local_5b0);
    Json::Value::Value((Value *)local_808,nullValue);
    Json::Reader::Reader((Reader *)local_140);
    if ((char)local_8d4 == '\0') {
      bVar3 = Json::Reader::parse((Reader *)local_140,&local_8c8,(Value *)local_808,true);
      if (bVar3) {
        pVVar13 = Json::Value::operator[]((Value *)local_808,"status");
        IVar5 = Json::Value::asInt(pVVar13);
        if (IVar5 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_620,"Bad status returned from CDash: ",0x20);
          pVVar13 = Json::Value::operator[]((Value *)local_808,"status");
          IVar5 = Json::Value::asInt(pVVar13);
          std::ostream::operator<<(local_620,IVar5);
          pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x27e,(char *)local_7e0._0_8_,false);
          goto LAB_0059476a;
        }
        pVVar13 = Json::Value::operator[]((Value *)local_808,"datafilesmd5");
        bVar3 = Json::Value::isArray(pVVar13);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_620,"bad datafilesmd5 value in response ",0x23);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_620,local_8c8._M_dataplus._M_p,
                              local_8c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x28d,(char *)local_7e0._0_8_,false);
          goto LAB_0059476a;
        }
        pVVar13 = Json::Value::operator[]((Value *)local_808,"datafilesmd5");
        pVVar13 = Json::Value::operator[](pVVar13,0);
        IVar5 = Json::Value::asInt(pVVar13);
        if (IVar5 != 1) goto LAB_00593e2f;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_620,"File already exists on CDash, skip upload ",0x2a);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_620,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x288,(char *)local_7e0._0_8_,(pcVar15->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
          operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
        std::ios_base::~ios_base(local_5b0);
        iVar4 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_620,"error parsing json string [",0x1b);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_620,local_8c8._M_dataplus._M_p,
                            local_8c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)local_7e0,(Reader *)local_140);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_7e0._0_8_,local_7e0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
          operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
        }
        pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x279,(char *)local_7e0._0_8_,false);
LAB_0059476a:
        if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
          operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
        std::ios_base::~ios_base(local_5b0);
        iVar4 = -1;
      }
    }
    else {
LAB_00593e2f:
      cmsys::SystemTools::GetFilenameName(&local_828,psVar8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_620,"type=",5);
      cmCTestCurl::Escape((string *)local_7e0,&local_1d0,source);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_620,(char *)local_7e0._0_8_,local_7e0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"md5=",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"filename=",9);
      cmCTestCurl::Escape(&local_8f8,&local_1d0,&local_828);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"&",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"buildid=",8);
      pVVar13 = Json::Value::operator[]((Value *)local_808,"buildid");
      Json::Value::asString_abi_cxx11_(&local_848,pVVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,local_848._M_dataplus._M_p,local_848._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_848._M_dataplus._M_p != &local_848.field_2) {
        operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
        operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
        operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
      }
      if ((char)local_8d4 == '\0') {
        std::__cxx11::stringbuf::str();
        bVar3 = cmCTestCurl::UploadFile(&local_1d0,psVar8,&local_898,(string *)local_7e0,&local_8c8)
        ;
        if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
          operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
        }
        if (!bVar3) goto LAB_00594228;
      }
      else {
        bVar3 = false;
LAB_00594228:
        local_850 = (long)local_8a8 * 1000000000;
        uVar14 = 0;
        do {
          pcVar15 = local_8d0;
          if (local_8a0 <= uVar14) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e0,"   Upload failed, waiting ",0x1a);
          poVar9 = std::ostream::_M_insert<long>((long)local_7e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds...\n",0xc);
          pcVar15 = local_8d0;
          pcVar1 = (local_8d0->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2a4,local_8f8._M_dataplus._M_p,
                       (pcVar15->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
            operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
          std::ios_base::~ios_base(local_770);
          lVar11 = std::chrono::_V2::steady_clock::now();
          lVar11 = lVar11 + local_850;
          while (lVar12 = std::chrono::_V2::steady_clock::now(), lVar12 < lVar11) {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e0,"   Retry upload: Attempt ",0x19);
          uVar14 = uVar14 + 1;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_7e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar15 = local_8d0;
          pcVar1 = (local_8d0->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2ae,local_8f8._M_dataplus._M_p,
                       (pcVar15->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
            operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
          std::ios_base::~ios_base(local_770);
          if ((char)local_8d4 == '\0') {
            std::__cxx11::stringbuf::str();
            bVar3 = cmCTestCurl::UploadFile
                              (&local_1d0,local_858,&local_898,(string *)local_7e0,&local_8c8);
            if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
              operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ + 1);
            }
          }
          pcVar15 = local_8d0;
        } while (bVar3 == false);
      }
      if (bVar3 == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7e0,"error uploading to CDash. ",0x1a);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7e0,(local_858->_M_dataplus)._M_p,
                            local_858->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_898._M_dataplus._M_p,local_898._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
          operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
        }
        pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,700,local_8f8._M_dataplus._M_p,false);
LAB_00594892:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
          operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
        std::ios_base::~ios_base(local_770);
        iVar4 = -1;
      }
      else {
        bVar3 = Json::Reader::parse((Reader *)local_140,&local_8c8,(Value *)local_808,true);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7e0,"error parsing json string [",0x1b);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7e0,local_8c8._M_dataplus._M_p,
                              local_8c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_8f8,(Reader *)local_140);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
            operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
          }
          pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2c3,local_8f8._M_dataplus._M_p,false);
          goto LAB_00594892;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7e0,"Upload file response: [",0x17);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7e0,local_8c8._M_dataplus._M_p,
                            local_8c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
        pcVar1 = (pcVar15->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x2c8,local_8f8._M_dataplus._M_p,(pcVar15->super_cmCTestGenericHandler).Quiet)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
          operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
        std::ios_base::~ios_base(local_770);
        iVar4 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
      std::ios_base::~ios_base(local_5b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_828._M_dataplus._M_p != &local_828.field_2) {
        operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p,local_90[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque(&local_f0)
    ;
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_140);
    Json::Value::~Value((Value *)local_808);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,
                    CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                             local_8c8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
  std::ios_base::~ios_base(local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,
                    CONCAT71(local_878.field_2._M_allocated_capacity._1_7_,
                             local_878.field_2._M_local_buf[0]) + 1);
  }
LAB_00594a4a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  cmCTestCurl::~cmCTestCurl(&local_1d0);
  return iVar4;
}

Assistant:

int cmCTestSubmitHandler::HandleCDashUploadFile(std::string const& file,
                                                std::string const& typeString)
{
  if (file.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Upload file not specified\n");
    return -1;
  }
  if (!cmSystemTools::FileExists(file)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Upload file not found: '" << file << "'\n");
    return -1;
  }
  cmCTestCurl curl(this->CTest);
  curl.SetQuiet(this->Quiet);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  curl.SetCurlOptions(args);
  auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
  if (submitInactivityTimeout != 0) {
    curl.SetTimeOutSeconds(submitInactivityTimeout);
  }
  curl.SetHttpHeaders(this->HttpHeaders);
  std::string url = this->CTest->GetSubmitURL();
  if (!cmHasLiteralPrefix(url, "http://") &&
      !cmHasLiteralPrefix(url, "https://")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Only http and https are supported for CDASH_UPLOAD\n");
    return -1;
  }

  std::string fields;
  std::string::size_type pos = url.find('?');
  if (pos != std::string::npos) {
    fields = url.substr(pos + 1);
    url.erase(pos);
  }
  bool internalTest = cmIsOn(this->GetOption("InternalTest"));

  // Get RETRY_COUNT and RETRY_DELAY values if they were set.
  std::string retryDelayString = *this->GetOption("RetryDelay");
  std::string retryCountString = *this->GetOption("RetryCount");
  auto retryDelay = std::chrono::seconds(0);
  if (!retryDelayString.empty()) {
    unsigned long retryDelayValue = 0;
    if (!cmStrToULong(retryDelayString, &retryDelayValue)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryDelayString
                                                      << std::endl);
    } else {
      retryDelay = std::chrono::seconds(retryDelayValue);
    }
  }
  unsigned long retryCount = 0;
  if (!retryCountString.empty()) {
    if (!cmStrToULong(retryCountString, &retryCount)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryCountString
                                                      << std::endl);
    }
  }

  std::string md5sum =
    cmSystemTools::ComputeFileHash(file, cmCryptoHash::AlgoMD5);
  // 1. request the buildid and check to see if the file
  //    has already been uploaded
  // TODO I added support for subproject. You would need to add
  // a "&subproject=subprojectname" to the first POST.
  cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
  cmake* cm = ch->GetCMake();
  cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
  // TODO: Encode values for a URL instead of trusting caller.
  std::ostringstream str;
  if (subproject) {
    str << "subproject=" << curl.Escape(*subproject) << "&";
  }
  auto timeNow =
    std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
  str << "stamp=" << curl.Escape(this->CTest->GetCurrentTag()) << "-"
      << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "model=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "build="
      << curl.Escape(this->CTest->GetCTestConfiguration("BuildName")) << "&"
      << "site=" << curl.Escape(this->CTest->GetCTestConfiguration("Site"))
      << "&"
      << "group=" << curl.Escape(this->CTest->GetTestModelString())
      << "&"
      // For now, we send both "track" and "group" to CDash in case we're
      // submitting to an older instance that still expects the prior
      // terminology.
      << "track=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "starttime=" << timeNow << "&"
      << "endtime=" << timeNow << "&"
      << "datafilesmd5[0]=" << md5sum << "&"
      << "type=" << curl.Escape(typeString);
  if (!fields.empty()) {
    fields += '&';
  }
  fields += str.str();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "fields: " << fields << "\nurl:" << url
                                << "\nfile: " << file << "\n",
                     this->Quiet);
  std::string response;

  bool requestSucceeded = curl.HttpRequest(url, fields, response);
  if (!internalTest && !requestSucceeded) {
    // If request failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Request failed, waiting " << retryDelay.count()
                                                       << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry request: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      requestSucceeded = curl.HttpRequest(url, fields, response);
      if (requestSucceeded) {
        break;
      }
    }
  }
  if (!internalTest && !requestSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in HttpRequest\n"
                 << response);
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Request upload response: [" << response << "]\n",
                     this->Quiet);
  Json::Value json;
  Json::Reader reader;
  if (!internalTest && !reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  if (!internalTest && json["status"].asInt() != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad status returned from CDash: " << json["status"].asInt());
    return -1;
  }
  if (!internalTest) {
    if (json["datafilesmd5"].isArray()) {
      int datares = json["datafilesmd5"][0].asInt();
      if (datares == 1) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "File already exists on CDash, skip upload "
                             << file << "\n",
                           this->Quiet);
        return 0;
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "bad datafilesmd5 value in response " << response << "\n");
      return -1;
    }
  }

  std::string upload_as = cmSystemTools::GetFilenameName(file);
  std::ostringstream fstr;
  fstr << "type=" << curl.Escape(typeString) << "&"
       << "md5=" << md5sum << "&"
       << "filename=" << curl.Escape(upload_as) << "&"
       << "buildid=" << json["buildid"].asString();

  bool uploadSucceeded = false;
  if (!internalTest) {
    uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
  }

  if (!uploadSucceeded) {
    // If upload failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Upload failed, waiting " << retryDelay.count()
                                                      << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry upload: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      if (!internalTest) {
        uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
      }
      if (uploadSucceeded) {
        break;
      }
    }
  }

  if (!uploadSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error uploading to CDash. " << file << " " << url << " "
                                            << fstr.str());
    return -1;
  }
  if (!reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Upload file response: [" << response << "]\n",
                     this->Quiet);
  return 0;
}